

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseInstance::AddExtensionInfo
          (DatabaseInstance *this,string *name,ExtensionLoadedInfo *info)

{
  __uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  __p;
  tuple<duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_> in_RAX;
  mapped_type *pmVar1;
  __uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl =
       (tuple<duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>)
       (tuple<duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
       .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl;
  make_uniq<duckdb::ExtensionLoadedInfo,duckdb::ExtensionLoadedInfo_const&>
            ((duckdb *)&local_18,info);
  pmVar1 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->loaded_extensions_info,name);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
       .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl =
       (tuple<duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>)
       (_Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>::
  reset((__uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
         *)&pmVar1->load_info,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionLoadedInfo_*,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionLoadedInfo_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
  ::~unique_ptr((unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
                 *)&local_18);
  return;
}

Assistant:

void DatabaseInstance::AddExtensionInfo(const string &name, const ExtensionLoadedInfo &info) {
	loaded_extensions_info[name].load_info = make_uniq<ExtensionLoadedInfo>(info);
}